

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

bool __thiscall QMenu::isEmpty(QMenu *this)

{
  qsizetype qVar1;
  char cVar2;
  byte bVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = 1;
  uVar4 = 0;
  while ((bVar3 & 1) != 0) {
    QWidget::actions((QList<QAction_*> *)&QStack_48,&this->super_QWidget);
    qVar1 = QStack_48.size;
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&QStack_48);
    if ((ulong)qVar1 <= uVar4) break;
    QWidget::actions((QList<QAction_*> *)&QStack_48,&this->super_QWidget);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&QStack_48);
    cVar2 = QAction::isSeparator();
    bVar3 = 1;
    if (cVar2 == '\0') {
      bVar3 = QAction::isVisible();
      bVar3 = bVar3 ^ 1;
    }
    uVar4 = uVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMenu::isEmpty() const
{
    bool ret = true;
    for(int i = 0; ret && i < actions().size(); ++i) {
        const QAction *action = actions().at(i);
        if (!action->isSeparator() && action->isVisible()) {
            ret = false;
        }
    }
    return ret;
}